

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void arena_prepare_base_deletion_sync
               (tsd_t *tsd,malloc_mutex_t *mtx,malloc_mutex_t **delayed_mtx,uint *n_delayed)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int iVar3;
  uint uVar4;
  mutex_prof_data_t *data;
  
  __mutex = (pthread_mutex_t *)((long)&mtx->field_0 + 0x48);
  iVar3 = pthread_mutex_trylock(__mutex);
  if (iVar3 != 0) {
    uVar4 = *n_delayed + 1;
    delayed_mtx[*n_delayed] = mtx;
    if (uVar4 == 0x20) {
      arena_prepare_base_deletion_sync_finish(tsd,delayed_mtx,0x20);
      uVar4 = 0;
    }
    *n_delayed = uVar4;
    return;
  }
  puVar1 = &(mtx->field_0).field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if (&((mtx->field_0).field_0.prof_data.prev_owner)->tsd != tsd) {
    (mtx->field_0).field_0.prof_data.prev_owner = (tsdn_t *)tsd;
    ppwVar2 = &(mtx->field_0).witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  (mtx->field_0).field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

static void
arena_prepare_base_deletion_sync(tsd_t *tsd, malloc_mutex_t *mtx,
    malloc_mutex_t **delayed_mtx, unsigned *n_delayed) {
	if (!malloc_mutex_trylock(tsd_tsdn(tsd), mtx)) {
		/* No contention. */
		malloc_mutex_unlock(tsd_tsdn(tsd), mtx);
		return;
	}
	unsigned n = *n_delayed;
	assert(n < ARENA_DESTROY_MAX_DELAYED_MTX);
	/* Add another to the batch. */
	delayed_mtx[n++] = mtx;

	if (n == ARENA_DESTROY_MAX_DELAYED_MTX) {
		arena_prepare_base_deletion_sync_finish(tsd, delayed_mtx, n);
		n = 0;
	}
	*n_delayed = n;
}